

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

_Bool help_greater_vault(chunk *c,loc_conflict centre,char *name)

{
  _Bool _Var1;
  uint32_t uVar2;
  int iVar3;
  wchar_t wVar4;
  char *typ2;
  
  typ2 = (char *)0x0;
  if (centre.y < c->height) {
    typ2 = (char *)(ulong)(centre.x < c->width);
  }
  if (dun->cent_n - dun->nstair_room <= (int)typ2) {
    if (c->depth < L'Z') {
      typ2 = (char *)0x5a;
      iVar3 = 1;
      uVar2 = 3;
      do {
        iVar3 = iVar3 * 2;
        uVar2 = uVar2 * 3;
        wVar4 = (int)typ2 + L'\xfffffff6';
        typ2 = (char *)(ulong)(uint)wVar4;
      } while (c->depth < wVar4);
    }
    else {
      uVar2 = 3;
      iVar3 = 1;
    }
    uVar2 = Rand_div(uVar2);
    if (((int)uVar2 < iVar3) &&
       ((iVar3 = strcmp(dun->profile->name,"classic"), iVar3 == 0 ||
        (uVar2 = Rand_div(3), uVar2 == 0)))) {
      _Var1 = build_vault_type(c,centre,name,typ2);
      return _Var1;
    }
  }
  return false;
}

Assistant:

static bool help_greater_vault(struct chunk *c, struct loc centre,
		const char *name)
{
	int i;
	int numerator   = 1;
	int denominator = 3;
	
	/*
	 * Only try to build a GV as the first non-staircase room.  If not
	 * finding space, cent_n has already been incremented.
	 */
	if (dun->cent_n - dun->nstair_room > ((centre.y >= c->height ||
		centre.x >= c->width) ? 0 : 1)) return false;

	/* Level 90+ has a 1/3 chance, level 80-89 has 2/9, ... */
	for (i = 90; i > c->depth; i -= 10) {
		numerator *= 2;
		denominator *= 3;
	}

	/* Attempt to pass the depth check and build a GV */
	if (randint0(denominator) >= numerator) return false;

	/* Non-classic profiles need to adjust the probability */
	if (!streq(dun->profile->name, "classic") && !one_in_(3)) return false;

	return build_vault_type(c, centre, name, NULL);
}